

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

OpCode ByteCodeGenerator::GetStFldOpCode
                 (FuncInfo *funcInfo,bool isRoot,bool isLetDecl,bool isConstDecl,
                 bool isClassMemberInit,bool forceStrictModeForClassComputedPropertyName)

{
  bool bVar1;
  OpCode OVar2;
  undefined1 local_16;
  bool forceStrictModeForClassComputedPropertyName_local;
  bool isClassMemberInit_local;
  bool isConstDecl_local;
  bool isLetDecl_local;
  bool isRoot_local;
  FuncInfo *funcInfo_local;
  
  bVar1 = FuncInfo::GetIsStrictMode(funcInfo);
  local_16 = 1;
  if (!bVar1) {
    local_16 = forceStrictModeForClassComputedPropertyName;
  }
  OVar2 = GetStFldOpCode((bool)(local_16 & 1),isRoot,isLetDecl,isConstDecl,isClassMemberInit);
  return OVar2;
}

Assistant:

Js::OpCode ByteCodeGenerator::GetStFldOpCode(FuncInfo* funcInfo, bool isRoot, bool isLetDecl, bool isConstDecl, bool isClassMemberInit, bool forceStrictModeForClassComputedPropertyName)
{
    return GetStFldOpCode(funcInfo->GetIsStrictMode() || forceStrictModeForClassComputedPropertyName, isRoot, isLetDecl, isConstDecl, isClassMemberInit);
}